

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O0

longdouble * __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::
compute_upper_bound(longdouble *__return_storage_ptr__,
                   branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double> *this)

{
  size_type sVar1;
  reference pvVar2;
  size_t e;
  size_t i;
  longdouble ret;
  branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double> *this_local;
  
  e = 0;
  sVar1 = std::
          vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
          ::size((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
                  *)(__return_storage_ptr__ + 2));
  for (; e != sVar1; e = e + 1) {
    pvVar2 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
             ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
                           *)(__return_storage_ptr__ + 2),e);
    if ((longdouble)0 < pvVar2->r) {
      std::
      vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
      ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
                    *)(__return_storage_ptr__ + 2),e);
    }
  }
  return (longdouble *)e;
}

Assistant:

Float compute_upper_bound() noexcept
    {
        Float ret = 0;

        if constexpr (std::is_same_v<Mode, minimize_tag>) {
            for (size_t i = 0, e = items.size(); i != e; ++i)
                if (items[i].r < 0)
                    ret += items[i].r;
        } else {
            for (size_t i = 0, e = items.size(); i != e; ++i)
                if (items[i].r > 0)
                    ret += items[i].r;
        }

        return ret;
    }